

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::compare(bigint *lhs,bigint *rhs)

{
  int iVar1;
  int iVar2;
  bigit bVar3;
  bigit bVar4;
  size_t sVar5;
  bigit rhs_bigit;
  bigit lhs_bigit;
  int end;
  int j;
  int i;
  int num_rhs_bigits;
  int num_lhs_bigits;
  bigint *rhs_local;
  bigint *lhs_local;
  
  iVar1 = bigint::num_bigits(lhs);
  iVar2 = bigint::num_bigits(rhs);
  if (iVar1 == iVar2) {
    sVar5 = buffer<unsigned_int>::size((buffer<unsigned_int> *)lhs);
    end = (int)sVar5 + -1;
    sVar5 = buffer<unsigned_int>::size((buffer<unsigned_int> *)rhs);
    lhs_bigit = (int)sVar5 - 1;
    rhs_bigit = end - lhs_bigit;
    if ((int)rhs_bigit < 0) {
      rhs_bigit = 0;
    }
    for (; (int)rhs_bigit <= end; end = end + -1) {
      bVar3 = bigint::operator[](lhs,end);
      bVar4 = bigint::operator[](rhs,lhs_bigit);
      if (bVar3 != bVar4) {
        if (bVar3 <= bVar4) {
          return -1;
        }
        return 1;
      }
      lhs_bigit = lhs_bigit - 1;
    }
    if (end == lhs_bigit) {
      lhs_local._4_4_ = 0;
    }
    else {
      lhs_local._4_4_ = -1;
      if ((int)lhs_bigit < end) {
        lhs_local._4_4_ = 1;
      }
    }
  }
  else {
    lhs_local._4_4_ = -1;
    if (iVar2 < iVar1) {
      lhs_local._4_4_ = 1;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

FMT_CONSTEXPR20 int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }